

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O2

route_id __thiscall helics::CoreBroker::getRoute(CoreBroker *this,GlobalFederateId fedid)

{
  BaseType BVar1;
  const_iterator cVar2;
  BaseType *pBVar3;
  key_type local_4;
  
  BVar1 = 0;
  if ((fedid.gid != 0) && (BVar1 = 0, (this->super_BrokerBase).higher_broker_id.gid != fedid.gid)) {
    cVar2 = CLI::std::
            _Hashtable<helics::GlobalFederateId,_std::pair<const_helics::GlobalFederateId,_helics::route_id>,_std::allocator<std::pair<const_helics::GlobalFederateId,_helics::route_id>_>,_std::__detail::_Select1st,_std::equal_to<helics::GlobalFederateId>,_std::hash<helics::GlobalFederateId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->routing_table)._M_h,&local_4);
    pBVar3 = &parent_route_id;
    if (cVar2.
        super__Node_iterator_base<std::pair<const_helics::GlobalFederateId,_helics::route_id>,_false>
        ._M_cur != (__node_type *)0x0) {
      pBVar3 = (BaseType *)
               ((long)cVar2.
                      super__Node_iterator_base<std::pair<const_helics::GlobalFederateId,_helics::route_id>,_false>
                      ._M_cur + 0xc);
    }
    BVar1 = *pBVar3;
  }
  return (route_id)BVar1;
}

Assistant:

route_id CoreBroker::getRoute(GlobalFederateId fedid) const
{
    if ((fedid == parent_broker_id) || (fedid == higher_broker_id)) {
        return parent_route_id;
    }
    auto fnd = routing_table.find(fedid);
    return (fnd != routing_table.end()) ? fnd->second :
                                          parent_route_id;  // zero is the default route
}